

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test::testBody
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test *this)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *pTVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  
  MemoryLeakDetector::disableAllocationTypeChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewArrayAllocator();
  pcVar3 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,100,"ALLOC.c",10,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar2,pcVar3,"FREE.c",100,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar4 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString
                     (((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->
                      message);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x18b,pTVar5);
  MemoryLeakDetector::enableAllocationTypeChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherTypeWithCheckingDisabled)
{
    detector->disableAllocationTypeChecking();
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultNewAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    STRCMP_EQUAL("", reporter->message->asCharString());
    detector->enableAllocationTypeChecking();
}